

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_map(_glist *x,t_floatarg f)

{
  int iVar1;
  t_selection *local_28;
  t_selection *sel;
  t_gobj *y;
  int flag;
  t_floatarg f_local;
  _glist *x_local;
  
  if (f == 0.0) {
    iVar1 = glist_isvisible(x);
    if (iVar1 != 0) {
      if ((*(ushort *)&x->field_0xe8 & 1) == 0) {
        bug("canvas_map");
      }
      else {
        pdgui_vmess((char *)0x0,"crs",x,"delete","all");
        *(ushort *)&x->field_0xe8 = *(ushort *)&x->field_0xe8 & 0xfffd;
      }
    }
  }
  else {
    iVar1 = glist_isvisible(x);
    if (iVar1 == 0) {
      if ((*(ushort *)&x->field_0xe8 & 1) == 0) {
        bug("canvas_map");
        canvas_vis(x,1.0);
      }
      for (sel = (t_selection *)x->gl_list; sel != (t_selection *)0x0; sel = sel->sel_next) {
        gobj_vis((t_gobj *)sel,x,1);
      }
      *(ushort *)&x->field_0xe8 = *(ushort *)&x->field_0xe8 & 0xfffd | 2;
      for (local_28 = x->gl_editor->e_selection; local_28 != (t_selection *)0x0;
          local_28 = local_28->sel_next) {
        gobj_select(local_28->sel_what,x,1);
      }
      canvas_drawlines(x);
      if (((*(ushort *)&x->field_0xe8 >> 8 & 1) != 0) && ((*(ushort *)&x->field_0xe8 >> 7 & 1) != 0)
         ) {
        canvas_drawredrect(x,1);
      }
      pdgui_vmess("pdtk_canvas_getscroll","c",x);
    }
  }
  return;
}

Assistant:

void canvas_map(t_canvas *x, t_floatarg f)
{
    int flag = (f != 0);
    t_gobj *y;
    if (flag)
    {
        if (!glist_isvisible(x))
        {
            t_selection *sel;
            if (!x->gl_havewindow)
            {
                bug("canvas_map");
                canvas_vis(x, 1);
            }
            for (y = x->gl_list; y; y = y->g_next)
                gobj_vis(y, x, 1);
            x->gl_mapped = 1;
            for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
                gobj_select(sel->sel_what, x, 1);
            canvas_drawlines(x);
            if (x->gl_isgraph && x->gl_goprect)
                canvas_drawredrect(x, 1);
            pdgui_vmess("pdtk_canvas_getscroll", "c", x);
        }
    }
    else
    {
        if (glist_isvisible(x))
        {
            if (!x->gl_havewindow)
            {
                bug("canvas_map");
                return;
            }
                /* just clear out the whole canvas */
            pdgui_vmess(0, "crs", x, "delete", "all");
            x->gl_mapped = 0;
        }
    }
}